

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void calculate_gf_length(AV1_COMP *cpi,int max_gop_length,int max_intervals)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  REGIONS *regions_00;
  int in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  bool bVar10;
  double dVar11;
  int n_2;
  int cur_region_idx;
  int best_reg;
  int n_1;
  int n;
  int count_f;
  double temp_accu_coeff;
  double this_score;
  int this_reg;
  int j_1;
  int last_blending;
  int met_blending;
  int j;
  double base_score;
  int last_frame;
  int first_frame;
  int best_j;
  double best_score;
  double arf_length_factor;
  int not_enough_regions;
  int is_last_analysed;
  int is_minor_sc;
  int r;
  int k_last;
  int k_start;
  int scenecut_idx;
  int num_regions;
  REGIONS *regions;
  int offset;
  int ori_last;
  GF_GROUP_STATS gf_stats;
  int cut_here;
  int cut_pos [16];
  int cur_last;
  int cur_start;
  int count_cuts;
  int min_shrink_int;
  int active_max_gf_interval;
  int active_min_gf_interval;
  int flash_detected;
  int i;
  int f_h;
  int f_w;
  FIRSTPASS_STATS *stats;
  FIRSTPASS_STATS *start_pos;
  FIRSTPASS_STATS next_frame;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  FIRSTPASS_STATS *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  TWO_PASS *in_stack_fffffffffffffcc8;
  TWO_PASS *in_stack_fffffffffffffcd0;
  double in_stack_fffffffffffffcd8;
  FIRSTPASS_STATS *in_stack_fffffffffffffce0;
  double in_stack_fffffffffffffce8;
  double in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  double local_300;
  GF_GROUP_STATS *in_stack_fffffffffffffd10;
  double local_2e8;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  uint local_2ac;
  uint local_2a8;
  int local_2a4;
  double local_2a0;
  double local_298;
  uint local_288;
  uint local_27c;
  double local_278;
  uint local_264;
  double local_260;
  int local_244;
  int local_23c;
  int local_238;
  FIRSTPASS_STATS local_220;
  int local_138;
  int local_134;
  int local_130;
  uint local_12c;
  int local_128;
  int local_124;
  FIRSTPASS_STATS *local_120;
  FIRSTPASS_STATS *local_118;
  undefined1 local_110 [232];
  TWO_PASS *local_28;
  PRIMARY_RATE_CONTROL *local_20;
  RATE_CONTROL *local_18;
  int local_10;
  int local_c;
  AV1_COMP *local_8;
  
  local_18 = &in_RDI->rc;
  local_20 = &in_RDI->ppi->p_rc;
  local_28 = &in_RDI->ppi->twopass;
  local_118 = (in_RDI->twopass_frame).stats_in;
  local_120 = local_118 + -(long)(int)(uint)((in_RDI->rc).frames_since_key == 0);
  local_124 = (in_RDI->common).width;
  local_128 = (in_RDI->common).height;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_110,0,0xe8);
  iVar5 = has_no_stats_stage(local_8);
  if (iVar5 == 0) {
    local_134 = local_18->min_gf_interval;
    if (local_18->max_gf_interval < local_c) {
      local_2c0 = local_18->max_gf_interval;
    }
    else {
      local_2c0 = local_c;
    }
    local_138 = local_2c0;
    local_2c4 = local_134;
    if (local_134 < 6) {
      local_2c4 = 6;
    }
    local_220.log_coded_error._4_4_ = local_2c4;
    local_12c = (uint)(local_18->frames_since_key == 0);
    if (local_8->ppi->lap_enabled == 0) {
      local_2c8 = local_10;
    }
    else {
      local_2c8 = 1;
    }
    local_10 = local_2c8;
    local_220.log_coded_error._0_4_ = 1;
    local_220.log_intra_error._4_4_ =
         (((local_8->ppi->gf_state).arf_gf_boost_lst != 0 ^ 0xffU) & 1) - 1;
    memset(&local_220.mv_in_out_count,0,0x40);
    local_220.mv_in_out_count._0_4_ = 0xffffffff;
    init_gf_stats((GF_GROUP_STATS *)&local_220);
    while (local_220.log_coded_error._0_4_ < local_10 + 1) {
      if ((int)local_12c < local_18->frames_to_key) {
        if ((int)(local_12c - local_220.log_intra_error._4_4_) <
            local_18->static_scene_max_gf_interval) {
          iVar5 = input_stats(in_stack_fffffffffffffcc8,
                              (TWO_PASS_FRAME *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              in_stack_fffffffffffffcb8);
          if (iVar5 == -1) {
            local_220.MVcv._4_4_ = 2;
          }
          else {
            local_130 = detect_flash(in_stack_fffffffffffffcd0,
                                     (TWO_PASS_FRAME *)in_stack_fffffffffffffcc8,
                                     in_stack_fffffffffffffcc4);
            accumulate_next_frame_stats
                      (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                       SUB84(in_stack_fffffffffffffcd8,0),
                       (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (GF_GROUP_STATS *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                       SUB84(in_stack_fffffffffffffcf0,0));
            in_stack_fffffffffffffcb8 = &local_220;
            local_220.MVcv._4_4_ =
                 detect_gf_cut((AV1_COMP *)
                               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                               (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                               SUB84(in_stack_fffffffffffffcf0,0),
                               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                               SUB84(in_stack_fffffffffffffce8,0),
                               (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                               in_stack_fffffffffffffd10);
          }
        }
        else {
          local_220.MVcv._4_4_ = 1;
        }
      }
      else {
        local_220.MVcv._4_4_ = 2;
      }
      if (local_220.MVcv._4_4_ != 0) {
        uVar6 = local_12c - 1;
        iVar7 = local_18->frames_since_key - local_20->regions_offset;
        regions_00 = local_20->regions;
        iVar5 = local_20->num_regions;
        local_238 = -1;
        local_220.log_intra_error._0_4_ = uVar6;
        if (((int)(uVar6 - local_220.log_intra_error._4_4_) <= local_138) &&
           ((int)local_220.log_intra_error._4_4_ < (int)uVar6)) {
          local_23c = find_regions_index(regions_00,iVar5,local_220.log_intra_error._4_4_ + iVar7);
          iVar8 = find_regions_index(regions_00,iVar5,local_220.log_intra_error._0_4_ + iVar7);
          local_244 = local_23c;
          if (local_220.log_intra_error._4_4_ + iVar7 == 0) {
            local_23c = 0;
            local_244 = local_23c;
          }
          do {
            local_244 = local_244 + 1;
            if (iVar8 < local_244) goto LAB_002aa1e2;
          } while ((regions_00[local_244].type != SCENECUT_REGION) ||
                  ((int)((regions_00[local_244].last - iVar7) - local_220.log_intra_error._4_4_) <=
                   local_134));
          local_238 = local_244;
LAB_002aa1e2:
          if (regions_00[iVar5 + -1].last - regions_00[local_238].last < 4) {
            local_238 = -1;
          }
          if (local_238 == -1) {
            bVar10 = false;
            if (iVar8 == iVar5 + -1) {
              bVar10 = local_220.log_intra_error._0_4_ + iVar7 == regions_00[iVar8].last;
            }
            if ((!bVar10) ||
               ((int)((regions_00[local_23c].type == SCENECUT_REGION) + 1) < iVar8 - local_23c)) {
              local_260 = 0.0;
              local_264 = 0xffffffff;
              iVar8 = regions_00->start;
              iVar1 = regions_00[iVar5 + -1].last;
              local_278 = 0.0;
              local_27c = local_220.log_intra_error._4_4_;
              while ((local_27c = local_27c + 1,
                     (int)local_27c <
                     (int)(local_220.log_intra_error._4_4_ + local_220.log_coded_error._4_4_) &&
                     (local_120 + (int)local_27c < local_28->stats_buf_ctx->stats_in_end))) {
                local_278 = (local_278 + 1.0) * local_120[(int)local_27c].cor_coeff;
              }
              bVar10 = false;
              bVar4 = false;
              for (local_288 = local_220.log_intra_error._4_4_ + local_220.log_coded_error._4_4_;
                  ((int)local_288 <= (int)local_220.log_intra_error._0_4_ &&
                  (local_120 + (int)local_288 < local_28->stats_buf_ctx->stats_in_end));
                  local_288 = local_288 + 1) {
                local_278 = (local_278 + 1.0) * local_120[(int)local_288].cor_coeff;
                iVar9 = find_regions_index(regions_00,iVar5,local_288 + iVar7);
                if (-1 < iVar9) {
                  if (regions_00[iVar9].type == BLENDING_REGION) {
                    bVar4 = true;
                    if (bVar10) break;
                    local_278 = 0.0;
                  }
                  else {
                    if (bVar4) {
                      bVar10 = true;
                    }
                    bVar4 = false;
                    local_298 = local_278 * 0.1;
                    local_2a0 = 1.0;
                    local_2a4 = 0;
                    local_2a8 = local_288;
                    while ((local_2a8 = local_2a8 + 1,
                           (int)local_2a8 <= (int)(local_288 + 3) && (int)local_2a8 <= iVar1 - iVar7
                           && (local_120 + (int)local_2a8 < local_28->stats_buf_ctx->stats_in_end)))
                    {
                      local_2a0 = local_120[(int)local_2a8].cor_coeff * local_2a0;
                      if (local_120[(int)local_2a8].intra_error <= 0.001) {
                        local_2e8 = 0.001;
                      }
                      else {
                        local_2e8 = local_120[(int)local_2a8].intra_error;
                      }
                      if (0.5 <= 1.0 - local_120[(int)local_2a8].noise_var / local_2e8) {
                        if (local_120[(int)local_2a8].intra_error <= 0.001) {
                          local_300 = 0.001;
                        }
                        else {
                          local_300 = local_120[(int)local_2a8].intra_error;
                        }
                        in_stack_fffffffffffffd10 =
                             (GF_GROUP_STATS *)
                             (1.0 - local_120[(int)local_2a8].noise_var / local_300);
                      }
                      else {
                        in_stack_fffffffffffffd10 = (GF_GROUP_STATS *)0x3fe0000000000000;
                      }
                      dVar11 = sqrt((double)in_stack_fffffffffffffd10);
                      local_298 = local_2a0 * dVar11 + local_298;
                      local_2a4 = local_2a4 + 1;
                    }
                    local_2a0 = 1.0;
                    for (local_2ac = local_288;
                        (bVar2 = (int)((local_288 - 6) + local_2a4) < (int)local_2ac,
                        bVar3 = iVar8 - iVar7 < (int)local_2ac,
                        in_stack_fffffffffffffcff = bVar2 && bVar3, bVar2 && bVar3 &&
                        (local_28->stats_buf_ctx->stats_in_start <= local_120 + (int)local_2ac));
                        local_2ac = local_2ac - 1) {
                      local_2a0 = local_120[(int)local_2ac].cor_coeff * local_2a0;
                      in_stack_fffffffffffffcf0 = local_120[(int)local_2ac].noise_var;
                      if (local_120[(int)local_2ac].intra_error <= 0.001) {
                        in_stack_fffffffffffffce0 = (FIRSTPASS_STATS *)0x3f50624dd2f1a9fc;
                      }
                      else {
                        in_stack_fffffffffffffce0 =
                             (FIRSTPASS_STATS *)local_120[(int)local_2ac].intra_error;
                      }
                      if (0.5 <= 1.0 - in_stack_fffffffffffffcf0 / (double)in_stack_fffffffffffffce0
                         ) {
                        in_stack_fffffffffffffcd0 = (TWO_PASS *)local_120[(int)local_2ac].noise_var;
                        if (local_120[(int)local_2ac].intra_error <= 0.001) {
                          in_stack_fffffffffffffcc8 = (TWO_PASS *)0x3f50624dd2f1a9fc;
                        }
                        else {
                          in_stack_fffffffffffffcc8 =
                               (TWO_PASS *)local_120[(int)local_2ac].intra_error;
                        }
                        in_stack_fffffffffffffcd8 =
                             1.0 - (double)in_stack_fffffffffffffcd0 /
                                   (double)in_stack_fffffffffffffcc8;
                      }
                      else {
                        in_stack_fffffffffffffcd8 = 0.5;
                      }
                      in_stack_fffffffffffffce8 = local_2a0;
                      dVar11 = sqrt(in_stack_fffffffffffffcd8);
                      local_298 = in_stack_fffffffffffffce8 * dVar11 + local_298;
                    }
                    if (local_260 < local_298) {
                      local_260 = local_298;
                      local_264 = local_288;
                    }
                  }
                }
              }
              iVar8 = find_regions_index(regions_00,iVar5,local_264 + iVar7);
              if ((((iVar8 < iVar5 + -1) && (0 < iVar8)) &&
                  (regions_00[iVar8 + -1].type == BLENDING_REGION)) &&
                 (regions_00[iVar8 + 1].type == BLENDING_REGION)) {
                if ((local_264 + iVar7 == regions_00[iVar8].start) &&
                   ((int)(local_264 + iVar7) < regions_00[iVar8].last)) {
                  local_264 = local_264 + 1;
                }
                else if ((local_264 + iVar7 == regions_00[iVar8].last) &&
                        (regions_00[iVar8].start < (int)(local_264 + iVar7))) {
                  local_264 = local_264 - 1;
                }
              }
              if ((int)(local_220.log_intra_error._0_4_ - local_264) < 2) {
                local_264 = local_220.log_intra_error._0_4_;
              }
              if ((0 < (int)local_264) && (0.1 < local_260)) {
                local_220.log_intra_error._0_4_ = local_264;
              }
            }
          }
          else {
            local_220.log_intra_error._0_4_ =
                 (regions_00[local_238].last - iVar7) -
                 (uint)((0.6 < regions_00[local_238].avg_cor_coeff *
                               (1.0 - local_120[regions_00[local_238].start - iVar7].noise_var /
                                      regions_00[local_238].avg_intra_err) ^ 0xffU) & 1);
          }
        }
        *(uint *)((long)&local_220.mv_in_out_count + (long)local_220.log_coded_error._0_4_ * 4) =
             local_220.log_intra_error._0_4_;
        local_220.log_coded_error._0_4_ = local_220.log_coded_error._0_4_ + 1;
        (local_8->twopass_frame).stats_in = local_118 + (int)local_220.log_intra_error._0_4_;
        local_220.log_intra_error._4_4_ = local_220.log_intra_error._0_4_;
        iVar5 = find_regions_index(regions_00,iVar5,local_220.log_intra_error._0_4_ + 1 + iVar7);
        if ((-1 < iVar5) && (regions_00[iVar5].type == SCENECUT_REGION)) {
          local_220.log_intra_error._4_4_ = local_220.log_intra_error._4_4_ + 1;
        }
        local_12c = local_220.log_intra_error._0_4_;
        if ((1 < local_220.MVcv._4_4_) && (local_220.log_intra_error._0_4_ == uVar6)) break;
        init_gf_stats((GF_GROUP_STATS *)&local_220);
      }
      local_12c = local_12c + 1;
    }
    local_18->intervals_till_gf_calculate_due = local_220.log_coded_error._0_4_ + -1;
    for (local_2b8 = 1; local_2b8 < local_220.log_coded_error._0_4_; local_2b8 = local_2b8 + 1) {
      local_20->gf_intervals[local_2b8 + -1] =
           *(int *)((long)&local_220.mv_in_out_count + (long)local_2b8 * 4) -
           *(int *)((long)&local_220.mv_in_out_count + (long)(local_2b8 + -1) * 4);
    }
    local_20->cur_gf_index = 0;
    (local_8->twopass_frame).stats_in = local_118;
  }
  else {
    for (local_12c = 0; (int)local_12c < 0xf; local_12c = local_12c + 1) {
      if (local_18->max_gf_interval < local_c) {
        local_2bc = local_18->max_gf_interval;
      }
      else {
        local_2bc = local_c;
      }
      local_20->gf_intervals[(int)local_12c] = local_2bc;
    }
    local_20->cur_gf_index = 0;
    local_18->intervals_till_gf_calculate_due = 0xf;
  }
  return;
}

Assistant:

static void calculate_gf_length(AV1_COMP *cpi, int max_gop_length,
                                int max_intervals) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  const FIRSTPASS_STATS *const stats = start_pos - (rc->frames_since_key == 0);

  const int f_w = cpi->common.width;
  const int f_h = cpi->common.height;
  int i;

  int flash_detected;

  av1_zero(next_frame);

  if (has_no_stats_stage(cpi)) {
    for (i = 0; i < MAX_NUM_GF_INTERVALS; i++) {
      p_rc->gf_intervals[i] = AOMMIN(rc->max_gf_interval, max_gop_length);
    }
    p_rc->cur_gf_index = 0;
    rc->intervals_till_gf_calculate_due = MAX_NUM_GF_INTERVALS;
    return;
  }

  // TODO(urvang): Try logic to vary min and max interval based on q.
  const int active_min_gf_interval = rc->min_gf_interval;
  const int active_max_gf_interval =
      AOMMIN(rc->max_gf_interval, max_gop_length);
  const int min_shrink_int = AOMMAX(MIN_SHRINK_LEN, active_min_gf_interval);

  i = (rc->frames_since_key == 0);
  max_intervals = cpi->ppi->lap_enabled ? 1 : max_intervals;
  int count_cuts = 1;
  // If cpi->gf_state.arf_gf_boost_lst is 0, we are starting with a KF or GF.
  int cur_start = -1 + !cpi->ppi->gf_state.arf_gf_boost_lst, cur_last;
  int cut_pos[MAX_NUM_GF_INTERVALS + 1] = { -1 };
  int cut_here;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  while (count_cuts < max_intervals + 1) {
    // reaches next key frame, break here
    if (i >= rc->frames_to_key) {
      cut_here = 2;
    } else if (i - cur_start >= rc->static_scene_max_gf_interval) {
      // reached maximum len, but nothing special yet (almost static)
      // let's look at the next interval
      cut_here = 1;
    } else if (EOF == input_stats(twopass, &cpi->twopass_frame, &next_frame)) {
      // reaches last frame, break
      cut_here = 2;
    } else {
      // Test for the case where there is a brief flash but the prediction
      // quality back to an earlier frame is then restored.
      flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);
      // TODO(bohanli): remove redundant accumulations here, or unify
      // this and the ones in define_gf_group
      accumulate_next_frame_stats(&next_frame, flash_detected,
                                  rc->frames_since_key, i, &gf_stats, f_w, f_h);

      cut_here = detect_gf_cut(cpi, i, cur_start, flash_detected,
                               active_max_gf_interval, active_min_gf_interval,
                               &gf_stats);
    }
    if (cut_here) {
      cur_last = i - 1;  // the current last frame in the gf group
      int ori_last = cur_last;
      // The region frame idx does not start from the same frame as cur_start
      // and cur_last. Need to offset them.
      int offset = rc->frames_since_key - p_rc->regions_offset;
      REGIONS *regions = p_rc->regions;
      int num_regions = p_rc->num_regions;

      int scenecut_idx = -1;
      // only try shrinking if interval smaller than active_max_gf_interval
      if (cur_last - cur_start <= active_max_gf_interval &&
          cur_last > cur_start) {
        // find the region indices of where the first and last frame belong.
        int k_start =
            find_regions_index(regions, num_regions, cur_start + offset);
        int k_last =
            find_regions_index(regions, num_regions, cur_last + offset);
        if (cur_start + offset == 0) k_start = 0;

        // See if we have a scenecut in between
        for (int r = k_start + 1; r <= k_last; r++) {
          if (regions[r].type == SCENECUT_REGION &&
              regions[r].last - offset - cur_start > active_min_gf_interval) {
            scenecut_idx = r;
            break;
          }
        }

        // if the found scenecut is very close to the end, ignore it.
        if (regions[num_regions - 1].last - regions[scenecut_idx].last < 4) {
          scenecut_idx = -1;
        }

        if (scenecut_idx != -1) {
          // If we have a scenecut, then stop at it.
          // TODO(bohanli): add logic here to stop before the scenecut and for
          // the next gop start from the scenecut with GF
          int is_minor_sc =
              (regions[scenecut_idx].avg_cor_coeff *
                   (1 - stats[regions[scenecut_idx].start - offset].noise_var /
                            regions[scenecut_idx].avg_intra_err) >
               0.6);
          cur_last = regions[scenecut_idx].last - offset - !is_minor_sc;
        } else {
          int is_last_analysed = (k_last == num_regions - 1) &&
                                 (cur_last + offset == regions[k_last].last);
          int not_enough_regions =
              k_last - k_start <=
              1 + (regions[k_start].type == SCENECUT_REGION);
          // if we are very close to the end, then do not shrink since it may
          // introduce intervals that are too short
          if (!(is_last_analysed && not_enough_regions)) {
            const double arf_length_factor = 0.1;
            double best_score = 0;
            int best_j = -1;
            const int first_frame = regions[0].start - offset;
            const int last_frame = regions[num_regions - 1].last - offset;
            // score of how much the arf helps the whole GOP
            double base_score = 0.0;
            // Accumulate base_score in
            for (int j = cur_start + 1; j < cur_start + min_shrink_int; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
            }
            int met_blending = 0;   // Whether we have met blending areas before
            int last_blending = 0;  // Whether the previous frame if blending
            for (int j = cur_start + min_shrink_int; j <= cur_last; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
              int this_reg =
                  find_regions_index(regions, num_regions, j + offset);
              if (this_reg < 0) continue;
              // A GOP should include at most 1 blending region.
              if (regions[this_reg].type == BLENDING_REGION) {
                last_blending = 1;
                if (met_blending) {
                  break;
                } else {
                  base_score = 0;
                  continue;
                }
              } else {
                if (last_blending) met_blending = 1;
                last_blending = 0;
              }

              // Add the factor of how good the neighborhood is for this
              // candidate arf.
              double this_score = arf_length_factor * base_score;
              double temp_accu_coeff = 1.0;
              // following frames
              int count_f = 0;
              for (int n = j + 1; n <= j + 3 && n <= last_frame; n++) {
                if (stats + n >= twopass->stats_buf_ctx->stats_in_end) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
                count_f++;
              }
              // preceding frames
              temp_accu_coeff = 1.0;
              for (int n = j; n > j - 3 * 2 + count_f && n > first_frame; n--) {
                if (stats + n < twopass->stats_buf_ctx->stats_in_start) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
              }

              if (this_score > best_score) {
                best_score = this_score;
                best_j = j;
              }
            }

            // For blending areas, move one more frame in case we missed the
            // first blending frame.
            int best_reg =
                find_regions_index(regions, num_regions, best_j + offset);
            if (best_reg < num_regions - 1 && best_reg > 0) {
              if (regions[best_reg - 1].type == BLENDING_REGION &&
                  regions[best_reg + 1].type == BLENDING_REGION) {
                if (best_j + offset == regions[best_reg].start &&
                    best_j + offset < regions[best_reg].last) {
                  best_j += 1;
                } else if (best_j + offset == regions[best_reg].last &&
                           best_j + offset > regions[best_reg].start) {
                  best_j -= 1;
                }
              }
            }

            if (cur_last - best_j < 2) best_j = cur_last;
            if (best_j > 0 && best_score > 0.1) cur_last = best_j;
            // if cannot find anything, just cut at the original place.
          }
        }
      }
      cut_pos[count_cuts] = cur_last;
      count_cuts++;

      // reset pointers to the shrunken location
      cpi->twopass_frame.stats_in = start_pos + cur_last;
      cur_start = cur_last;
      int cur_region_idx =
          find_regions_index(regions, num_regions, cur_start + 1 + offset);
      if (cur_region_idx >= 0)
        if (regions[cur_region_idx].type == SCENECUT_REGION) cur_start++;

      i = cur_last;

      if (cut_here > 1 && cur_last == ori_last) break;

      // reset accumulators
      init_gf_stats(&gf_stats);
    }
    ++i;
  }

  // save intervals
  rc->intervals_till_gf_calculate_due = count_cuts - 1;
  for (int n = 1; n < count_cuts; n++) {
    p_rc->gf_intervals[n - 1] = cut_pos[n] - cut_pos[n - 1];
  }
  p_rc->cur_gf_index = 0;
  cpi->twopass_frame.stats_in = start_pos;
}